

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * vera::toHueRainbow(Image *__return_storage_ptr__,Image *_in)

{
  int iVar1;
  int iVar2;
  uint _width;
  uint _height;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  float _hue;
  vec3 local_40;
  
  iVar2 = (*_in->_vptr_Image[8])(_in);
  if (iVar2 < 2) {
    _width = (*_in->_vptr_Image[6])(_in);
    _height = (*_in->_vptr_Image[7])(_in);
    Image::Image(__return_storage_ptr__,_width,_height,3);
    if (0 < (int)_height) {
      uVar5 = 0;
      do {
        if (0 < (int)_width) {
          uVar4 = 0;
          do {
            iVar2 = __return_storage_ptr__->m_width;
            iVar1 = __return_storage_ptr__->m_channels;
            iVar3 = (*_in->_vptr_Image[0xe])(_in,uVar4,uVar5);
            (*_in->_vptr_Image[0x18])(_in,CONCAT44(extraout_var,iVar3));
            local_40 = hue2rgb(_hue);
            (*__return_storage_ptr__->_vptr_Image[0x12])
                      (__return_storage_ptr__,((long)iVar2 * uVar5 + uVar4) * (long)iVar1,&local_40,
                       3);
            uVar4 = uVar4 + 1;
          } while (_width != uVar4);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != _height);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The input image have more than one channel",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    Image::Image(__return_storage_ptr__,_in);
  }
  return __return_storage_ptr__;
}

Assistant:

Image toHueRainbow(const Image& _in) {
    if (_in.getChannels() > 1) {
        std::cout << "The input image have more than one channel" << std::endl;
        return _in;
    }

    int width = _in.getWidth();
    int height = _in.getHeight();
    Image out = Image(width, height, 3);
    for (int y = 0; y < height; y++)
        for(int x = 0; x < width; x++)
            out.setColor( out.getIndex(x,y), hue2rgb( _in.getValue(_in.getIndex(x,y)) ) );

    return out;
}